

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
                *this,void **vtt,int64_t id,TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  void *pvVar1;
  long lVar2;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,id,matind,mesh);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle +
                   -2) + *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZTriangleSphere
            (&this->fGeo,nodeindexes);
  lVar2 = 0x938;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar2 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle + -2) +
     lVar2) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar2 + -0x50) =
         0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x9e0);
  for (lVar2 = 0x938; lVar2 != 0x9e0; lVar2 = lVar2 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar2 + -0x50) =
         0xffffffffffffffff;
    *(undefined4 *)
     ((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle + -2) +
     lVar2) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Initialize
            (&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(id,matind,mesh) , fGeo(nodeindexes) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}